

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O0

void __thiscall Varnode::printCover(Varnode *this,ostream *s)

{
  LowlevelError *this_00;
  ostream *this_01;
  allocator local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *s_local;
  Varnode *this_local;
  
  local_18 = s;
  s_local = (ostream *)this;
  if (this->cover == (Cover *)0x0) {
    this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"No cover to print",&local_39);
    LowlevelError::LowlevelError(this_00,(string *)local_38);
    __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if ((this->flags & 0x2000000) == 0) {
    Cover::print(this->cover,s);
  }
  else {
    this_01 = std::operator<<(s,"Cover is dirty");
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Varnode::printCover(ostream &s) const

{
  if (cover == (Cover *)0)
    throw LowlevelError("No cover to print");
  if ((flags & Varnode::coverdirty)!=0)
    s << "Cover is dirty" << endl;
  else
    cover->print(s);
}